

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.hpp
# Opt level: O2

void __thiscall
pico_tree::internal::box_base<pico_tree::internal::box<double,_2UL>_>::fit
          (box_base<pico_tree::internal::box<double,_2UL>_> *this,scalar_type *x)

{
  size_type i;
  double dVar1;
  
  for (i = 0; i != 2; i = i + 1) {
    dVar1 = x[i];
    if (dVar1 < *(double *)(this + i * 8)) {
      *(double *)(this + i * 8) = dVar1;
      dVar1 = x[i];
    }
    if (*(double *)(this + i * 8 + 0x10) <= dVar1 && dVar1 != *(double *)(this + i * 8 + 0x10)) {
      *(double *)(this + i * 8 + 0x10) = dVar1;
    }
  }
  return;
}

Assistant:

constexpr void fit(scalar_type const* x) {
    for (size_type i = 0; i < derived().size(); ++i) {
      if (x[i] < min(i)) {
        min(i) = x[i];
      }
      if (x[i] > max(i)) {
        max(i) = x[i];
      }
    }
  }